

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUtility.h
# Opt level: O2

void assert::are_equal<std::__cxx11::string,std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,string *msg
               )

{
  __type b;
  ostream *poVar1;
  ostringstream s;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,(string *)msg);
  poVar1 = std::operator<<(poVar1,"(expected: ");
  poVar1 = std::operator<<(poVar1,(string *)expected);
  poVar1 = std::operator<<(poVar1,", actual: ");
  poVar1 = std::operator<<(poVar1,(string *)actual);
  std::operator<<(poVar1,")");
  b = std::operator==(expected,actual);
  std::__cxx11::stringbuf::str();
  is_true(b,&sStack_1b8);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void are_equal(const T1& expected, const T2& actual, std::string msg = "")
    {
        std::ostringstream s{};
        s << msg << "(expected: " << expected << ", actual: " << actual << ")";
        is_true(expected == actual, s.str());
    }